

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_descending_eig_twod(REF_DBL *d)

{
  REF_DBL RVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  pdVar5 = d + 5;
  dVar9 = -2.0;
  uVar4 = 0xffffffffffffffff;
  for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
    dVar10 = pdVar5[-2] * 0.0 + pdVar5[-1] * 0.0 + *pdVar5;
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    if (dVar9 < dVar10) {
      uVar4 = uVar8;
    }
    uVar4 = uVar4 & 0xffffffff;
    if (dVar10 <= dVar9) {
      dVar10 = dVar9;
    }
    dVar9 = dVar10;
    pdVar5 = pdVar5 + 3;
  }
  iVar3 = (int)uVar4;
  if (iVar3 != 2) {
    if (iVar3 == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x175,"ref_matrix_descending_eig_twod","better dot not found, no z preference");
      return 1;
    }
    RVar1 = d[2];
    d[2] = d[iVar3];
    d[iVar3] = RVar1;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      RVar1 = d[lVar6 + 9];
      iVar7 = iVar3 * 3 + 3 + (int)lVar6;
      d[lVar6 + 9] = d[iVar7];
      d[iVar7] = RVar1;
    }
  }
  dVar9 = *d;
  if (dVar9 < d[1]) {
    *d = d[1];
    d[1] = dVar9;
    for (lVar6 = -0x18; lVar6 != 0; lVar6 = lVar6 + 8) {
      uVar2 = *(undefined8 *)((long)d + lVar6 + 0x30);
      *(undefined8 *)((long)d + lVar6 + 0x30) = *(undefined8 *)((long)d + lVar6 + 0x48);
      *(undefined8 *)((long)d + lVar6 + 0x48) = uVar2;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_descending_eig_twod(REF_DBL *d) {
  REF_DBL temp;
  REF_INT i, zdir;
  REF_DBL dot, best_dot;
  REF_DBL znorm[] = {0, 0, 1};

  best_dot = -2.0;
  zdir = REF_EMPTY;
  for (i = 0; i < 3; i++) {
    dot = ABS(ref_math_dot(znorm, ref_matrix_vec_ptr(d, i)));
    if (dot > best_dot) {
      best_dot = dot;
      zdir = i;
    }
  }
  RUS(REF_EMPTY, zdir, "better dot not found, no z preference");

  if (2 != zdir) {
    temp = ref_matrix_eig(d, 2);
    ref_matrix_eig(d, 2) = ref_matrix_eig(d, zdir);
    ref_matrix_eig(d, zdir) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 2);
      ref_matrix_vec(d, i, 2) = ref_matrix_vec(d, i, zdir);
      ref_matrix_vec(d, i, zdir) = temp;
    }
  }

  if (ref_matrix_eig(d, 1) > ref_matrix_eig(d, 0)) {
    temp = ref_matrix_eig(d, 0);
    ref_matrix_eig(d, 0) = ref_matrix_eig(d, 1);
    ref_matrix_eig(d, 1) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 0);
      ref_matrix_vec(d, i, 0) = ref_matrix_vec(d, i, 1);
      ref_matrix_vec(d, i, 1) = temp;
    }
  }

  return REF_SUCCESS;
}